

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMemShallowCopy(Mem *pTo,Mem *pFrom,int srcType)

{
  undefined2 uVar1;
  char *pcVar2;
  u16 uVar3;
  u8 uVar4;
  u8 uVar5;
  
  if ((pTo->flags & 0x9000) == 0) {
    uVar3 = pFrom->flags;
    uVar4 = pFrom->enc;
    uVar5 = pFrom->eSubtype;
    pTo->n = pFrom->n;
    pTo->flags = uVar3;
    pTo->enc = uVar4;
    pTo->eSubtype = uVar5;
    pcVar2 = pFrom->z;
    pTo->u = pFrom->u;
    pTo->z = pcVar2;
    if ((pFrom->flags & 0x2000) == 0) {
      uVar1 = pTo->flags;
      pTo->flags = uVar1 & 0x8fff | (ushort)srcType;
    }
    return;
  }
  vdbeMemClearExternAndSetNull(pTo);
  sqlite3VdbeMemShallowCopy(pTo,pFrom,srcType);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemShallowCopy(Mem *pTo, const Mem *pFrom, int srcType){
  assert( !sqlite3VdbeMemIsRowSet(pFrom) );
  assert( pTo->db==pFrom->db );
  if( VdbeMemDynamic(pTo) ){ vdbeClrCopy(pTo,pFrom,srcType); return; }
  memcpy(pTo, pFrom, MEMCELLSIZE);
  if( (pFrom->flags&MEM_Static)==0 ){
    pTo->flags &= ~(MEM_Dyn|MEM_Static|MEM_Ephem);
    assert( srcType==MEM_Ephem || srcType==MEM_Static );
    pTo->flags |= srcType;
  }
}